

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

Gia_Man_t * Lf_ManDeriveMappingGia(Lf_Man_t *p)

{
  int iVar1;
  Jf_Par_t *pJVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  undefined8 uVar5;
  Vec_Mem_t *pVVar6;
  long lVar7;
  byte bVar8;
  int iVar9;
  int *piVar10;
  undefined4 *__s;
  Vec_Int_t *p_00;
  int *piVar11;
  Vec_Int_t *p_01;
  Vec_Int_t *vMemory;
  Vec_Int_t *p_02;
  Gia_Man_t *p_03;
  size_t sVar12;
  char *pcVar13;
  Gia_Man_t *pGVar14;
  Gia_Obj_t *pGVar15;
  Lf_Cut_t *pLVar16;
  ulong uVar17;
  ulong *puVar18;
  int iVar19;
  ulong uVar20;
  word *pwVar21;
  uint uVar22;
  int iVar23;
  int Fill;
  int Fill_00;
  int Fill_01;
  int Fill_02;
  int iVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  ulong uVar28;
  word *pwVar29;
  uint uVar30;
  word *pTruth;
  long lVar31;
  bool bVar32;
  word *pLimit;
  int pVarsNew [13];
  word pTruthCof [128];
  uint local_4a8 [2];
  word *local_4a0;
  ulong local_498;
  ulong *local_490;
  ulong local_488;
  long local_480;
  int local_478 [16];
  word local_438 [129];
  
  pGVar14 = p->pGia;
  iVar23 = pGVar14->nObjs;
  piVar10 = (int *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar23 - 1U) {
    iVar9 = iVar23;
  }
  piVar10[1] = 0;
  *piVar10 = iVar9;
  if (iVar9 == 0) {
    __s = (undefined4 *)0x0;
  }
  else {
    __s = (undefined4 *)malloc((long)iVar9 << 2);
  }
  *(undefined4 **)(piVar10 + 2) = __s;
  piVar10[1] = iVar23;
  if (__s != (undefined4 *)0x0) {
    memset(__s,0xff,(long)iVar23 << 2);
  }
  pJVar2 = p->pPars;
  iVar24 = (pGVar14->nObjs + (int)pJVar2->Area) * 2 + (int)pJVar2->Edge;
  iVar1 = (int)pJVar2->Mux7;
  iVar9 = iVar24 + iVar1 * 4;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar19 = 0x10;
  if (0xe < (iVar24 + iVar1 * 4) - 1U) {
    iVar19 = iVar9;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar19;
  if (iVar19 == 0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)malloc((long)iVar19 << 2);
  }
  p_00->pArray = piVar11;
  p_00->nSize = iVar9;
  if (piVar11 != (int *)0x0) {
    memset(piVar11,0,(long)iVar9 << 2);
  }
  iVar9 = (int)pJVar2->Area;
  iVar1 = (int)pJVar2->Edge;
  iVar24 = iVar1 + iVar9 * 2 + 1000;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar19 = 0x10;
  if (0xe < iVar1 + iVar9 * 2 + 999U) {
    iVar19 = iVar24;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar19;
  if (iVar19 == 0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)malloc((long)iVar19 << 2);
  }
  p_01->pArray = piVar11;
  p_01->nSize = iVar24;
  if (piVar11 != (int *)0x0) {
    memset(piVar11,0,(long)iVar24 << 2);
  }
  vMemory = (Vec_Int_t *)malloc(0x10);
  vMemory->nCap = 0x10000;
  vMemory->nSize = 0;
  piVar11 = (int *)malloc(0x40000);
  vMemory->pArray = piVar11;
  p_02 = (Vec_Int_t *)malloc(0x10);
  p_02->nCap = 0x10;
  p_02->nSize = 0;
  piVar11 = (int *)malloc(0x40);
  p_02->pArray = piVar11;
  if (pJVar2->fCutMin == 0) {
    __assert_fail("p->pPars->fCutMin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaLf.c"
                  ,0x744,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
  }
  p_03 = Gia_ManStart(pGVar14->nObjs);
  pGVar14 = p->pGia;
  pcVar3 = pGVar14->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
  else {
    sVar12 = strlen(pcVar3);
    pcVar13 = (char *)malloc(sVar12 + 1);
    strcpy(pcVar13,pcVar3);
  }
  p_03->pName = pcVar13;
  pcVar3 = pGVar14->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
  else {
    sVar12 = strlen(pcVar3);
    pcVar13 = (char *)malloc(sVar12 + 1);
    strcpy(pcVar13,pcVar3);
  }
  p_03->pSpec = pcVar13;
  if (0 < iVar23) {
    *__s = 0;
    pGVar14 = p->pGia;
    uVar20 = (ulong)(uint)pGVar14->nObjs;
    if (1 < pGVar14->nObjs) {
      lVar26 = 1;
      do {
        pGVar4 = pGVar14->pObjs;
        uVar5 = *(undefined8 *)(pGVar4 + lVar26);
        uVar30 = (uint)uVar5;
        if ((uVar30 & 0x9fffffff) == 0x9fffffff) {
          pGVar15 = Gia_ManAppendObj(p_03);
          uVar20 = *(ulong *)pGVar15;
          *(ulong *)pGVar15 = uVar20 | 0x9fffffff;
          *(ulong *)pGVar15 =
               uVar20 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_03->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar4 = p_03->pObjs;
          if ((pGVar15 < pGVar4) || (pGVar4 + p_03->nObjs <= pGVar15)) {
LAB_0076be28:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_03->vCis,(int)((ulong)((long)pGVar15 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = p_03->pObjs;
          if ((pGVar15 < pGVar4) || (pGVar4 + p_03->nObjs <= pGVar15)) goto LAB_0076be28;
          if (piVar10[1] <= lVar26) goto LAB_0076be47;
          *(int *)(*(long *)(piVar10 + 2) + lVar26 * 4) =
               (int)((ulong)((long)pGVar15 - (long)pGVar4) >> 2) * 0x55555556;
        }
        else {
          iVar23 = (int)lVar26;
          if ((~uVar30 & 0x1fffffff) == 0 || -1 < (int)uVar30) {
            if ((((int)uVar30 < 0) || (uVar22 = uVar30 & 0x1fffffff, uVar22 == 0x1fffffff)) ||
               (uVar22 != ((uint)((ulong)uVar5 >> 0x20) & 0x1fffffff))) {
              if ((p->vOffsets).nSize <= lVar26) {
LAB_0076bdea:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              iVar9 = (p->vOffsets).pArray[lVar26];
              if (((long)iVar9 < 0) || ((p->vMapRefs).nSize <= iVar9)) goto LAB_0076bdea;
              if ((p->vMapRefs).pArray[iVar9] != 0) {
                pLVar16 = Lf_ObjCutBest(p,iVar23);
                uVar30 = pLVar16->iFunc;
                if ((int)uVar30 < 0) {
                  __assert_fail("pCut->iFunc >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaLf.c"
                                ,0x761,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
                }
                uVar22 = *(uint *)&pLVar16->field_0x14;
                if (uVar22 < 0x1000000) {
                  if (1 < uVar30) {
                    __assert_fail("Abc_Lit2Var(pCut->iFunc) == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaLf.c"
                                  ,0x764,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
                  }
                  if (piVar10[1] <= lVar26) goto LAB_0076be47;
                  *(uint *)(*(long *)(piVar10 + 2) + lVar26 * 4) = uVar30;
                }
                else if ((uVar22 & 0xff000000) == 0x1000000) {
                  if ((uVar30 & 0x7ffffffe) != 2) {
                    __assert_fail("Abc_Lit2Var(pCut->iFunc) == 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaLf.c"
                                  ,0x76a,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
                  }
                  iVar23 = (int)pLVar16[1].Sign;
                  if (((long)iVar23 < 0) || (piVar10[1] <= iVar23)) goto LAB_0076bdea;
                  uVar22 = *(uint *)(*(long *)(piVar10 + 2) + (long)iVar23 * 4);
                  if ((int)uVar22 < 0) goto LAB_0076be66;
                  if (piVar10[1] <= lVar26) goto LAB_0076be47;
                  *(uint *)(*(long *)(piVar10 + 2) + lVar26 * 4) = uVar22 ^ uVar30 & 1;
                }
                else {
                  uVar30 = p->pPars->nLutSizeMux;
                  if ((uVar30 == 0) || (uVar22 = uVar22 >> 0x18, uVar30 != uVar22)) {
                    p_02->nSize = 0;
                    uVar30 = *(uint *)&pLVar16->field_0x14;
                    if ((uVar30 >> 0x17 & 1) == 0) {
                      if (0xffffff < uVar30) {
                        uVar20 = 0;
                        do {
                          iVar23 = *(int *)((long)&pLVar16[1].Sign + uVar20 * 4);
                          if (((long)iVar23 < 0) || (piVar10[1] <= iVar23)) goto LAB_0076bdea;
                          Vec_IntPush(p_02,*(int *)(*(long *)(piVar10 + 2) + (long)iVar23 * 4));
                          uVar20 = uVar20 + 1;
                        } while (uVar20 < (byte)pLVar16->field_0x17);
                      }
                    }
                    else {
                      if ((uVar30 & 0xff000000) != 0x3000000) {
                        __assert_fail("pCut->nLeaves == 3",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaLf.c"
                                      ,0x725,
                                      "int Lf_ManDerivePart(Lf_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Lf_Cut_t *, Vec_Int_t *, Vec_Int_t *, Gia_Obj_t *)"
                                     );
                      }
                      iVar23 = (int)pLVar16[1].Sign;
                      if (((long)iVar23 < 0) || (iVar9 = piVar10[1], iVar9 <= iVar23))
                      goto LAB_0076bdea;
                      lVar25 = *(long *)(piVar10 + 2);
                      uVar30 = *(uint *)(lVar25 + (long)iVar23 * 4);
                      if ((int)uVar30 < 0) goto LAB_0076be66;
                      pGVar4 = pGVar4 + lVar26;
                      Vec_IntPush(p_02,*(uint *)pGVar4 >> 0x1d & 1 ^ uVar30);
                      iVar23 = *(int *)((long)&pLVar16[1].Sign + 4);
                      if (((long)iVar23 < 0) || (iVar9 <= iVar23)) goto LAB_0076bdea;
                      uVar30 = *(uint *)(lVar25 + (long)iVar23 * 4);
                      if ((int)uVar30 < 0) goto LAB_0076be66;
                      Vec_IntPush(p_02,(uint)((ulong)*(undefined8 *)pGVar4 >> 0x3d) & 1 ^ uVar30);
                      iVar23 = pLVar16[1].Delay;
                      if (((long)iVar23 < 0) || (iVar9 <= iVar23)) goto LAB_0076bdea;
                      uVar30 = *(uint *)(lVar25 + (long)iVar23 * 4);
                      pGVar14 = p->pGia;
                      if (pGVar14->pMuxes == (uint *)0x0) {
                        uVar22 = 0;
                      }
                      else {
                        pGVar15 = pGVar14->pObjs;
                        if ((pGVar4 < pGVar15) || (pGVar15 + pGVar14->nObjs <= pGVar4))
                        goto LAB_0076be28;
                        uVar22 = pGVar14->pMuxes
                                 [(int)((ulong)((long)pGVar4 - (long)pGVar15) >> 2) * -0x55555555];
                        if ((int)uVar22 < 0) goto LAB_0076bf3f;
                        uVar22 = uVar22 & 1;
                      }
                      if ((int)uVar30 < 0) goto LAB_0076be66;
                      Vec_IntPush(p_02,uVar22 ^ uVar30);
                    }
                    if (pLVar16->iFunc < 0) goto LAB_0076be09;
                    pVVar6 = p->vTtMem;
                    uVar30 = (uint)pLVar16->iFunc >> 1;
                    if (pVVar6->nEntries <= (int)uVar30) goto LAB_0076bf5e;
                    uVar30 = Kit_TruthToGia(p_03,(uint *)(pVVar6->ppPages
                                                          [uVar30 >> ((byte)pVVar6->LogPageSze &
                                                                     0x1f)] +
                                                         (ulong)(uVar30 & pVVar6->PageMask) *
                                                         (long)pVVar6->nEntrySize),p_02->nSize,
                                            vMemory,p_02,0);
                    if ((int)uVar30 < 0) goto LAB_0076be09;
                    uVar22 = uVar30 >> 1;
                    iVar23 = p_01->nSize;
                    Vec_IntFillExtra(p_00,uVar22 + 1,Fill_01);
                    if (p_00->nSize <= (int)uVar22) goto LAB_0076be47;
                    p_00->pArray[uVar22] = iVar23;
                    Vec_IntPush(p_01,p_02->nSize);
                    if (0 < p_02->nSize) {
                      lVar25 = 0;
                      do {
                        if (p_02->pArray[lVar25] < 0) goto LAB_0076be09;
                        Vec_IntPush(p_01,(uint)p_02->pArray[lVar25] >> 1);
                        lVar25 = lVar25 + 1;
                      } while (lVar25 < p_02->nSize);
                    }
                    uVar27 = -uVar22;
                    if ((*(uint *)&pLVar16->field_0x14 >> 0x17 & 1) == 0) {
                      uVar27 = uVar22;
                    }
                  }
                  else {
                    if (pLVar16->iFunc < 0) {
LAB_0076be09:
                      __assert_fail("Lit >= 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                    ,0x12f,"int Abc_Lit2Var(int)");
                    }
                    pVVar6 = p->vTtMem;
                    uVar30 = (uint)pLVar16->iFunc >> 1;
                    if (pVVar6->nEntries <= (int)uVar30) {
LAB_0076bf5e:
                      __assert_fail("i >= 0 && i < p->nEntries",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                                    ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
                    }
                    pTruth = pVVar6->ppPages[uVar30 >> ((byte)pVVar6->LogPageSze & 0x1f)] +
                             (ulong)(uVar30 & pVVar6->PageMask) * (long)pVVar6->nEntrySize;
                    uVar30 = p->pPars->nLutSize;
                    local_488 = (ulong)uVar30;
                    uVar27 = 1 << ((char)uVar30 - 6U & 0x1f);
                    if ((int)uVar30 < 7) {
                      uVar27 = 1;
                    }
                    uVar30 = Lf_ManFindCofVar(pTruth,uVar27,uVar22);
                    if (uVar22 <= uVar30) {
                      __assert_fail("iVar >= 0 && iVar < (int)pCut->nLeaves",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaLf.c"
                                    ,0x6fc,
                                    "int Lf_ManDerivePart(Lf_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Lf_Cut_t *, Vec_Int_t *, Vec_Int_t *, Gia_Obj_t *)"
                                   );
                    }
                    iVar9 = uVar30 - 6;
                    uVar22 = 1 << ((byte)iVar9 & 0x1f);
                    iVar23 = 2 << ((byte)iVar9 & 0x1f);
                    uVar20 = 1;
                    if (1 < (int)uVar22) {
                      uVar20 = (ulong)uVar22;
                    }
                    local_498 = (ulong)(uint)(1 << ((byte)uVar30 & 0x1f));
                    local_4a0 = local_438 + (int)uVar22;
                    local_480 = (long)(int)uVar22 << 3;
                    lVar25 = 0;
                    local_490 = pTruth;
                    do {
                      uVar22 = *(uint *)&pLVar16->field_0x14 >> 0x18;
                      if (0xffffff < *(uint *)&pLVar16->field_0x14) {
                        uVar17 = 0;
                        do {
                          local_478[uVar17] = (int)uVar17;
                          uVar17 = uVar17 + 1;
                        } while (uVar22 != uVar17);
                      }
                      bVar8 = (byte)local_498;
                      if (lVar25 == 0) {
                        if (uVar27 == 1) {
                          uVar17 = s_Truths6Neg[(int)uVar30] & *local_490;
                          local_438[0] = uVar17 << (bVar8 & 0x3f);
                          goto LAB_0076b5f0;
                        }
                        if ((int)uVar30 < 6) {
                          if (0 < (int)uVar27) {
                            uVar17 = s_Truths6Neg[(int)uVar30];
                            uVar28 = 0;
                            do {
                              local_438[uVar28] =
                                   (local_490[uVar28] & uVar17) << (bVar8 & 0x3f) |
                                   local_490[uVar28] & uVar17;
                              uVar28 = uVar28 + 1;
                            } while (uVar27 != uVar28);
                          }
                        }
                        else if (0 < (int)uVar27) {
                          pwVar21 = local_438;
                          puVar18 = local_490;
                          pwVar29 = local_4a0;
                          do {
                            if (iVar9 != 0x1f) {
                              uVar17 = 0;
                              do {
                                pwVar21[uVar17] = puVar18[uVar17];
                                pwVar29[uVar17] = puVar18[uVar17];
                                uVar17 = uVar17 + 1;
                              } while (uVar20 != uVar17);
                            }
                            puVar18 = puVar18 + iVar23;
                            pwVar29 = pwVar29 + iVar23;
                            pwVar21 = pwVar21 + iVar23;
                          } while (puVar18 < pTruth + (int)uVar27);
                        }
                      }
                      else if (uVar27 == 1) {
                        uVar17 = s_Truths6[(int)uVar30] & *local_490;
                        local_438[0] = uVar17 >> (bVar8 & 0x3f);
LAB_0076b5f0:
                        local_438[0] = local_438[0] | uVar17;
                      }
                      else if ((int)uVar30 < 6) {
                        if (0 < (int)uVar27) {
                          uVar17 = s_Truths6[(int)uVar30];
                          uVar28 = 0;
                          do {
                            local_438[uVar28] =
                                 (local_490[uVar28] & uVar17) >> (bVar8 & 0x3f) |
                                 local_490[uVar28] & uVar17;
                            uVar28 = uVar28 + 1;
                          } while (uVar27 != uVar28);
                        }
                      }
                      else if (0 < (int)uVar27) {
                        pwVar21 = local_438;
                        puVar18 = local_490;
                        do {
                          if (iVar9 != 0x1f) {
                            uVar17 = 0;
                            do {
                              pwVar21[uVar17] = *(word *)((long)puVar18 + uVar17 * 8 + local_480);
                              *(undefined8 *)((long)pwVar21 + uVar17 * 8 + local_480) =
                                   *(undefined8 *)((long)puVar18 + uVar17 * 8 + local_480);
                              uVar17 = uVar17 + 1;
                            } while (uVar20 != uVar17);
                          }
                          puVar18 = puVar18 + iVar23;
                          pwVar21 = pwVar21 + iVar23;
                        } while (puVar18 < pTruth + (int)uVar27);
                      }
                      uVar22 = Abc_TtMinBase(local_438,local_478,uVar22,(int)local_488);
                      if ((int)uVar22 < 1) {
                        __assert_fail("nVarsNew > 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaLf.c"
                                      ,0x706,
                                      "int Lf_ManDerivePart(Lf_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Lf_Cut_t *, Vec_Int_t *, Vec_Int_t *, Gia_Obj_t *)"
                                     );
                      }
                      p_02->nSize = 0;
                      uVar17 = 0;
                      do {
                        iVar1 = *(int *)((long)&pLVar16[1].Sign + (long)local_478[uVar17] * 4);
                        if (((long)iVar1 < 0) || (iVar19 = piVar10[1], iVar19 <= iVar1))
                        goto LAB_0076bdea;
                        lVar7 = *(long *)(piVar10 + 2);
                        Vec_IntPush(p_02,*(int *)(lVar7 + (long)iVar1 * 4));
                        uVar17 = uVar17 + 1;
                      } while (uVar22 != uVar17);
                      uVar22 = Kit_TruthToGia(p_03,(uint *)local_438,uVar22,vMemory,p_02,0);
                      local_4a8[lVar25] = uVar22;
                      if ((int)uVar22 < 0) goto LAB_0076be09;
                      uVar22 = uVar22 >> 1;
                      iVar1 = p_01->nSize;
                      Vec_IntFillExtra(p_00,uVar22 + 1,Fill);
                      if (p_00->nSize <= (int)uVar22) goto LAB_0076be47;
                      p_00->pArray[uVar22] = iVar1;
                      Vec_IntPush(p_01,p_02->nSize);
                      if (0 < p_02->nSize) {
                        lVar31 = 0;
                        do {
                          if (p_02->pArray[lVar31] < 0) goto LAB_0076be09;
                          Vec_IntPush(p_01,(uint)p_02->pArray[lVar31] >> 1);
                          lVar31 = lVar31 + 1;
                        } while (lVar31 < p_02->nSize);
                      }
                      Vec_IntPush(p_01,uVar22);
                      bVar32 = lVar25 == 0;
                      lVar25 = lVar25 + 1;
                    } while (bVar32);
                    local_438[0] = 0xcacacacacacacaca;
                    p_02->nSize = 0;
                    Vec_IntPush(p_02,local_4a8[0]);
                    Vec_IntPush(p_02,local_4a8[1]);
                    iVar23 = *(int *)((long)&pLVar16[1].Sign + (ulong)uVar30 * 4);
                    if (((long)iVar23 < 0) || (iVar19 <= iVar23)) goto LAB_0076bdea;
                    Vec_IntPush(p_02,*(int *)(lVar7 + (long)iVar23 * 4));
                    uVar30 = Kit_TruthToGia(p_03,(uint *)local_438,p_02->nSize,vMemory,p_02,0);
                    if ((int)uVar30 < 0) goto LAB_0076be09;
                    uVar22 = uVar30 >> 1;
                    iVar23 = p_01->nSize;
                    Vec_IntFillExtra(p_00,uVar22 + 1,Fill_00);
                    if (p_00->nSize <= (int)uVar22) goto LAB_0076be47;
                    p_00->pArray[uVar22] = iVar23;
                    Vec_IntPush(p_01,p_02->nSize);
                    if (0 < p_02->nSize) {
                      lVar25 = 0;
                      do {
                        if (p_02->pArray[lVar25] < 0) goto LAB_0076be09;
                        Vec_IntPush(p_01,(uint)p_02->pArray[lVar25] >> 1);
                        lVar25 = lVar25 + 1;
                      } while (lVar25 < p_02->nSize);
                    }
                    uVar27 = -uVar22;
                  }
                  Vec_IntPush(p_01,uVar27);
                  if (pLVar16->iFunc < 0) {
LAB_0076bf3f:
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                  ,0x130,"int Abc_LitIsCompl(int)");
                  }
                  if ((int)uVar30 < 0) {
LAB_0076be66:
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                  ,0x132,"int Abc_LitNotCond(int, int)");
                  }
                  if (piVar10[1] <= lVar26) goto LAB_0076be47;
                  *(uint *)(*(long *)(piVar10 + 2) + lVar26 * 4) = pLVar16->iFunc & 1U ^ uVar30;
                }
              }
            }
            else {
              if ((int)uVar20 <= lVar26) goto LAB_0076be28;
              uVar22 = iVar23 - uVar22;
              if (((int)uVar22 < 0) || (iVar23 = piVar10[1], iVar23 <= (int)uVar22))
              goto LAB_0076bdea;
              lVar25 = *(long *)(piVar10 + 2);
              uVar22 = *(uint *)(lVar25 + (ulong)uVar22 * 4);
              if ((int)uVar22 < 0) goto LAB_0076be66;
              iVar9 = Gia_ManAppendBuf(p_03,uVar22 ^ uVar30 >> 0x1d & 1);
              if (iVar23 <= lVar26) goto LAB_0076be47;
              *(int *)(lVar25 + lVar26 * 4) = iVar9;
            }
          }
          else {
            if ((int)uVar20 <= lVar26) goto LAB_0076be28;
            uVar22 = iVar23 - (uVar30 & 0x1fffffff);
            if (((int)uVar22 < 0) || (piVar10[1] <= (int)uVar22)) goto LAB_0076bdea;
            uVar22 = *(uint *)(*(long *)(piVar10 + 2) + (ulong)uVar22 * 4);
            if ((int)uVar22 < 0) goto LAB_0076be66;
            Gia_ManAppendCo(p_03,uVar22 ^ uVar30 >> 0x1d & 1);
          }
        }
        lVar26 = lVar26 + 1;
        pGVar14 = p->pGia;
        uVar20 = (ulong)pGVar14->nObjs;
      } while (lVar26 < (long)uVar20);
    }
    if (*(void **)(piVar10 + 2) != (void *)0x0) {
      free(*(void **)(piVar10 + 2));
      piVar10[2] = 0;
      piVar10[3] = 0;
    }
    free(piVar10);
    if (vMemory->pArray != (int *)0x0) {
      free(vMemory->pArray);
      vMemory->pArray = (int *)0x0;
    }
    free(vMemory);
    if (p_02->pArray != (int *)0x0) {
      free(p_02->pArray);
      p_02->pArray = (int *)0x0;
    }
    free(p_02);
    iVar23 = p_03->nObjs;
    if (iVar23 < p_00->nSize) {
      p_00->nSize = iVar23;
    }
    else {
      Vec_IntFillExtra(p_00,iVar23,Fill_02);
    }
    if (p_00->nSize != p_03->nObjs) {
      __assert_fail("Vec_IntSize(vMapping) == Gia_ManObjNum(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaLf.c"
                    ,0x77a,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
    }
    if (0 < p_00->nSize) {
      piVar10 = p_00->pArray;
      lVar26 = 0;
      do {
        iVar23 = piVar10[lVar26];
        if (0 < iVar23) {
          piVar10[lVar26] = iVar23 + p_03->nObjs;
        }
        lVar26 = lVar26 + 1;
      } while (lVar26 < p_00->nSize);
    }
    iVar23 = p_01->nSize;
    if (0 < (long)iVar23) {
      piVar10 = p_01->pArray;
      lVar26 = 0;
      do {
        Vec_IntPush(p_00,piVar10[lVar26]);
        lVar26 = lVar26 + 1;
      } while (iVar23 != lVar26);
    }
    if (p_01->pArray != (int *)0x0) {
      free(p_01->pArray);
      p_01->pArray = (int *)0x0;
    }
    free(p_01);
    if (p_03->vMapping != (Vec_Int_t *)0x0) {
      __assert_fail("pNew->vMapping == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaLf.c"
                    ,0x781,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
    }
    p_03->vMapping = p_00;
    Gia_ManSetRegNum(p_03,p->pGia->nRegs);
    return p_03;
  }
LAB_0076be47:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

Gia_Man_t * Lf_ManDeriveMappingGia( Lf_Man_t * p )
{
    Gia_Man_t * pNew; 
    Gia_Obj_t * pObj; 
    Vec_Int_t * vCopies   = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vMapping  = Vec_IntStart( 2*Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + 2*(int)p->pPars->Area + 4*(int)p->pPars->Mux7 );
    Vec_Int_t * vMapping2 = Vec_IntStart( (int)p->pPars->Edge + 2*(int)p->pPars->Area + 1000 );
    Vec_Int_t * vCover    = Vec_IntAlloc( 1 << 16 );
    Vec_Int_t * vLeaves   = Vec_IntAlloc( 16 );
    Lf_Cut_t * pCut;
    int i, iLit; 
    assert( p->pPars->fCutMin );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p->pGia) );
    pNew->pName = Abc_UtilStrsav( p->pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pGia->pSpec );
    Vec_IntWriteEntry( vCopies, 0, 0 );
    Gia_ManForEachObj1( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
        {
            Vec_IntWriteEntry( vCopies, i, Gia_ManAppendCi(pNew) );
            continue;
        }
        if ( Gia_ObjIsCo(pObj) )
        {
            iLit = Vec_IntEntry( vCopies, Gia_ObjFaninId0p(p->pGia, pObj) );
            iLit = Gia_ManAppendCo( pNew, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
            continue;
        }
        if ( Gia_ObjIsBuf(pObj) )
        {
            iLit = Vec_IntEntry( vCopies, Gia_ObjFaninId0p(p->pGia, pObj) );
            iLit = Gia_ManAppendBuf( pNew, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
            Vec_IntWriteEntry( vCopies, i, iLit );
            continue;
        }
        if ( !Lf_ObjMapRefNum(p, i) )
            continue;
        pCut = Lf_ObjCutBest( p, i );
        assert( pCut->iFunc >= 0 );
        if ( pCut->nLeaves == 0 )
        {
            assert( Abc_Lit2Var(pCut->iFunc) == 0 );
            Vec_IntWriteEntry( vCopies, i, pCut->iFunc );
            continue;
        }
        if ( pCut->nLeaves == 1 )
        {
            assert( Abc_Lit2Var(pCut->iFunc) == 1 );
            iLit = Vec_IntEntry( vCopies, pCut->pLeaves[0] );
            Vec_IntWriteEntry( vCopies, i, Abc_LitNotCond(iLit, Abc_LitIsCompl(pCut->iFunc)) );
            continue;
        }
        iLit = Lf_ManDerivePart( p, pNew, vMapping, vMapping2, vCopies, pCut, vLeaves, vCover, pObj );
        Vec_IntWriteEntry( vCopies, i, Abc_LitNotCond(iLit, Abc_LitIsCompl(pCut->iFunc)) );
    }
    Vec_IntFree( vCopies );
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    // finish mapping 
    if ( Vec_IntSize(vMapping) > Gia_ManObjNum(pNew) )
        Vec_IntShrink( vMapping, Gia_ManObjNum(pNew) );
    else
        Vec_IntFillExtra( vMapping, Gia_ManObjNum(pNew), 0 );
    assert( Vec_IntSize(vMapping) == Gia_ManObjNum(pNew) );
    Vec_IntForEachEntry( vMapping, iLit, i )
        if ( iLit > 0 )
            Vec_IntAddToEntry( vMapping, i, Gia_ManObjNum(pNew) );
    Vec_IntAppend( vMapping, vMapping2 );
    Vec_IntFree( vMapping2 );
    // attach mapping and packing
    assert( pNew->vMapping == NULL );
    pNew->vMapping = vMapping;
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p->pGia) );
    return pNew;
}